

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

optional<std::shared_ptr<ExpressionAstNode>_> * __thiscall
Parser::parseIdentifierOrFunctionInvocationExpression
          (optional<std::shared_ptr<ExpressionAstNode>_> *__return_storage_ptr__,Parser *this)

{
  int iVar1;
  undefined1 local_68 [24];
  size_type __dnew;
  undefined8 local_48;
  undefined1 local_40;
  
  TokenBuffer::currentToken((TokenBuffer *)&__dnew);
  iVar1 = *(int *)(__dnew + 0x20);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48);
  }
  if (iVar1 != 0x18) {
    TokenBuffer::currentToken((TokenBuffer *)local_68);
    local_68._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x17;
    __dnew = (size_type)&stack0xffffffffffffffc0;
    __dnew = std::__cxx11::string::_M_create(&__dnew,(ulong)(local_68 + 0x10));
    _local_40 = local_68._16_8_;
    builtin_strncpy((char *)__dnew,"Expected an identifier.",0x17);
    local_48 = local_68._16_8_;
    *(char *)(__dnew + local_68._16_8_) = '\0';
    reportError(this,(shared_ptr<Token> *)local_68,(string *)&__dnew);
    if ((undefined1 *)__dnew != &stack0xffffffffffffffc0) {
      operator_delete((void *)__dnew,(ulong)(_local_40 + 1));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
    }
    (__return_storage_ptr__->super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>)
    ._M_payload.super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged = false;
    return __return_storage_ptr__;
  }
  do {
    TokenBuffer::tokenAt
              ((TokenBuffer *)&__dnew,
               (size_t)(this->tokenBuffer).
                       super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    iVar1 = *(int *)(__dnew + 0x20);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48);
    }
  } while (iVar1 == 4);
  TokenBuffer::tokenAt
            ((TokenBuffer *)&__dnew,
             (size_t)(this->tokenBuffer).super___shared_ptr<TokenBuffer,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
  iVar1 = *(int *)(__dnew + 0x20);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48);
  }
  if (iVar1 == 5) {
    parseFunctionInvocationLike<FunctionInvocationExpressionAstNode>
              ((optional<std::shared_ptr<FunctionInvocationExpressionAstNode>_> *)&__dnew,this,
               Identifier);
    (__return_storage_ptr__->super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>)
    ._M_payload.super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged = false;
    if ((bool)local_40 != true) goto LAB_0010d4c2;
    std::optional<std::shared_ptr<ExpressionAstNode>>::
    emplace<std::shared_ptr<FunctionInvocationExpressionAstNode>const&>
              ((optional<std::shared_ptr<ExpressionAstNode>> *)__return_storage_ptr__,
               (shared_ptr<FunctionInvocationExpressionAstNode> *)&__dnew);
  }
  else {
    parseIdentiferExpression
              ((optional<std::shared_ptr<IdentifierExpressionAstNode>_> *)&__dnew,this);
    (__return_storage_ptr__->super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>)
    ._M_payload.super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged = false;
    if ((bool)local_40 != true) goto LAB_0010d4c2;
    std::optional<std::shared_ptr<ExpressionAstNode>>::
    emplace<std::shared_ptr<IdentifierExpressionAstNode>const&>
              ((optional<std::shared_ptr<ExpressionAstNode>> *)__return_storage_ptr__,
               (shared_ptr<IdentifierExpressionAstNode> *)&__dnew);
  }
LAB_0010d4c2:
  if (((local_40 & 1) != 0) &&
     (_local_40 = _local_40 & 0xffffffffffffff00,
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48 !=
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<ExpressionAstNode>>
Parser::parseIdentifierOrFunctionInvocationExpression() noexcept {

  if (this->tokenBuffer->currentToken()->tokenType != TokenType::Identifier) {
    this->reportError(this->tokenBuffer->currentToken(), "Expected an identifier.");
    return std::nullopt;
  }

  std::size_t lookAhead = 1;
  while (this->tokenBuffer->tokenAt(lookAhead)->tokenType == TokenType::WhiteSpace) {
    lookAhead++;
  }

  if (this->tokenBuffer->tokenAt(lookAhead)->tokenType == TokenType::LeftParen) {
    return this->parseFunctionInvocationExpression();
  }

  return this->parseIdentiferExpression();
}